

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloom_test.cc
# Opt level: O3

double __thiscall leveldb::BloomTest::FalsePositiveRate(BloomTest *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  char buffer [4];
  int local_3c;
  Slice local_38;
  
  iVar2 = 0;
  iVar3 = 1000000000;
  do {
    local_38.size_ = 4;
    local_3c = iVar3;
    local_38.data_ = (char *)&local_3c;
    bVar1 = Matches(this,&local_38);
    iVar2 = iVar2 + (uint)bVar1;
    iVar3 = iVar3 + 1;
  } while (iVar3 != 0x3b9af110);
  return (double)iVar2 / 10000.0;
}

Assistant:

double FalsePositiveRate() {
    char buffer[sizeof(int)];
    int result = 0;
    for (int i = 0; i < 10000; i++) {
      if (Matches(Key(i + 1000000000, buffer))) {
        result++;
      }
    }
    return result / 10000.0;
  }